

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O2

DecodePsbtLockingScriptStruct * __thiscall
cfd::js::api::json::DecodePsbtLockingScript::ConvertToStruct
          (DecodePsbtLockingScriptStruct *__return_storage_ptr__,DecodePsbtLockingScript *this)

{
  DecodePsbtLockingScriptStruct::DecodePsbtLockingScriptStruct(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->hex);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->type);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->address);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

DecodePsbtLockingScriptStruct DecodePsbtLockingScript::ConvertToStruct() const {  // NOLINT
  DecodePsbtLockingScriptStruct result;
  result.asm_ = asm__;
  result.hex = hex_;
  result.type = type_;
  result.address = address_;
  result.ignore_items = ignore_items;
  return result;
}